

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

void __thiscall
vkt::texture::SampleVerifier::SampleVerifier
          (SampleVerifier *this,ImageViewParameters *imParams,SamplerParameters *samplerParams,
          SampleLookupSettings *sampleLookupSettings,int coordBits,int mipmapBits,
          FloatFormat *conversionPrecision,FloatFormat *filteringPrecision,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *levels)

{
  YesNoMaybe YVar1;
  bool bVar2;
  undefined7 uVar3;
  int iVar4;
  int iVar5;
  YesNoMaybe YVar6;
  uint uVar7;
  int iVar8;
  
  this->m_imParams = imParams;
  this->m_samplerParams = samplerParams;
  this->m_sampleLookupSettings = sampleLookupSettings;
  this->m_coordBits = coordBits;
  this->m_mipmapBits = mipmapBits;
  (this->m_conversionPrecision).m_maxValue = conversionPrecision->m_maxValue;
  iVar8 = conversionPrecision->m_minExp;
  iVar4 = conversionPrecision->m_maxExp;
  iVar5 = conversionPrecision->m_fractionBits;
  YVar6 = conversionPrecision->m_hasSubnormal;
  YVar1 = conversionPrecision->m_hasNaN;
  bVar2 = conversionPrecision->m_exactPrecision;
  uVar3 = *(undefined7 *)&conversionPrecision->field_0x19;
  (this->m_conversionPrecision).m_hasInf = conversionPrecision->m_hasInf;
  (this->m_conversionPrecision).m_hasNaN = YVar1;
  (this->m_conversionPrecision).m_exactPrecision = bVar2;
  *(undefined7 *)&(this->m_conversionPrecision).field_0x19 = uVar3;
  (this->m_conversionPrecision).m_minExp = iVar8;
  (this->m_conversionPrecision).m_maxExp = iVar4;
  (this->m_conversionPrecision).m_fractionBits = iVar5;
  (this->m_conversionPrecision).m_hasSubnormal = YVar6;
  (this->m_filteringPrecision).m_maxValue = filteringPrecision->m_maxValue;
  iVar8 = filteringPrecision->m_minExp;
  iVar4 = filteringPrecision->m_maxExp;
  iVar5 = filteringPrecision->m_fractionBits;
  YVar6 = filteringPrecision->m_hasSubnormal;
  YVar1 = filteringPrecision->m_hasNaN;
  bVar2 = filteringPrecision->m_exactPrecision;
  uVar3 = *(undefined7 *)&filteringPrecision->field_0x19;
  (this->m_filteringPrecision).m_hasInf = filteringPrecision->m_hasInf;
  (this->m_filteringPrecision).m_hasNaN = YVar1;
  (this->m_filteringPrecision).m_exactPrecision = bVar2;
  *(undefined7 *)&(this->m_filteringPrecision).field_0x19 = uVar3;
  (this->m_filteringPrecision).m_minExp = iVar8;
  (this->m_filteringPrecision).m_maxExp = iVar4;
  (this->m_filteringPrecision).m_fractionBits = iVar5;
  (this->m_filteringPrecision).m_hasSubnormal = YVar6;
  uVar7 = imParams->dim - IMG_DIM_1D;
  iVar8 = 3;
  if (uVar7 < 4) {
    iVar8 = *(int *)(&DAT_00b84f50 + (ulong)uVar7 * 4);
  }
  this->m_unnormalizedDim = iVar8;
  this->m_levels = levels;
  return;
}

Assistant:

SampleVerifier::SampleVerifier (const ImageViewParameters&						imParams,
								const SamplerParameters&						samplerParams,
								const SampleLookupSettings&						sampleLookupSettings,
								int												coordBits,
								int												mipmapBits,
								const tcu::FloatFormat&							conversionPrecision,
								const tcu::FloatFormat&							filteringPrecision,
								const std::vector<tcu::ConstPixelBufferAccess>&	levels)
	: m_imParams				(imParams)
	, m_samplerParams			(samplerParams)
	, m_sampleLookupSettings	(sampleLookupSettings)
	, m_coordBits				(coordBits)
	, m_mipmapBits				(mipmapBits)
	, m_conversionPrecision		(conversionPrecision)
	, m_filteringPrecision		(filteringPrecision)
	, m_unnormalizedDim			(calcUnnormalizedDim(imParams.dim))
	, m_levels					(levels)
{

}